

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,OpaqueType *type)

{
  ostream *poVar1;
  Type *type_00;
  string sStack_88;
  string local_68;
  string local_48;
  
  poVar1 = std::operator<<(this->m_stream,"<opaque name=\"");
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&sStack_88,&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  Typelib::Type::getSize();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_68,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(&sStack_88,type,type_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&sStack_88);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</opaque>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(OpaqueType const& type)
    {
        m_stream << "<opaque name=\"" << xmlEscape(type.getName()) << "\" size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</opaque>";
        return true;
    }